

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O1

Person * __thiscall Person::operator=(Person *this,Person *person)

{
  std::__cxx11::string::_M_assign((string *)&this->id);
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->address);
  std::__cxx11::string::_M_assign((string *)&(this->address).city);
  std::__cxx11::string::_M_assign((string *)&(this->address).street);
  return this;
}

Assistant:

Person &Person::operator=(const Person &person) {
    id = person.id;
    name = person.name;
    address = person.address;
    return *this;
}